

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::ParseAddtlInfo_SnapSetInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  uint *puVar2;
  void **ppvVar3;
  TTDVar pvVar4;
  ulong uVar5;
  
  puVar2 = (uint *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  *puVar2 = uVar1;
  if (uVar1 == 0) {
    puVar2[2] = 0;
    puVar2[3] = 0;
  }
  else {
    ppvVar3 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)uVar1);
    *(void ***)(puVar2 + 2) = ppvVar3;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (*puVar2 != 0) {
      uVar5 = 0;
      do {
        pvVar4 = NSSnapValues::ParseTTDVar(uVar5 != 0,reader);
        *(TTDVar *)(*(long *)(puVar2 + 2) + uVar5 * 8) = pvVar4;
        uVar5 = uVar5 + 1;
      } while (uVar5 < *puVar2);
    }
    (*reader->_vptr_FileReader[5])(reader);
  }
  if (snpObject->SnapObjectTag == SnapSetObject) {
    snpObject->AddtlSnapObjectInfo = puVar2;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapSetInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapSetInfo* setInfo = alloc.SlabAllocateStruct<SnapSetInfo>();

            setInfo->SetSize = reader->ReadLengthValue(true);
            if(setInfo->SetSize == 0)
            {
                setInfo->SetValueArray = nullptr;
            }
            else
            {
                setInfo->SetValueArray = alloc.SlabAllocateArray<TTDVar>(setInfo->SetSize);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < setInfo->SetSize; ++i)
                {
                    setInfo->SetValueArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
                }
                reader->ReadSequenceEnd();
            }

            SnapObjectSetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(snpObject, setInfo);
        }